

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtzone.cpp
# Opt level: O2

UnicodeString * icu_63::appendMillis(UDate date,UnicodeString *str)

{
  bool bVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int32_t digits [20];
  
  if (-1.84303902528e+17 <= date) {
    if (date <= 1.838821689216e+17) {
      uVar5 = (ulong)date;
    }
    else {
      uVar5 = 0x28d47dbbf19b000;
    }
  }
  else {
    uVar5 = 0xfd713893bf19b000;
  }
  uVar4 = -uVar5;
  if (0 < (long)uVar5) {
    uVar4 = uVar5;
  }
  uVar2 = 0;
  do {
    uVar7 = uVar2;
    digits[uVar7] = (int32_t)(uVar4 % 10);
    bVar1 = 9 < uVar4;
    uVar4 = uVar4 / 10;
    uVar2 = uVar7 + 1;
  } while (bVar1);
  uVar6 = (uint)uVar7;
  if (-1 < (long)uVar5) goto LAB_0021210a;
  iVar3 = 0x2d;
  while( true ) {
    uVar6 = (uint)uVar7;
    UnicodeString::append(str,(char16_t)iVar3);
LAB_0021210a:
    if ((int)uVar6 < 0) break;
    uVar7 = (ulong)(uVar6 - 1);
    iVar3 = digits[uVar6] + 0x30;
  }
  return str;
}

Assistant:

static UnicodeString& appendMillis(UDate date, UnicodeString& str) {
    UBool negative = FALSE;
    int32_t digits[20]; // max int64_t is 20 decimal digits
    int32_t i;
    int64_t number;

    if (date < MIN_MILLIS) {
        number = (int64_t)MIN_MILLIS;
    } else if (date > MAX_MILLIS) {
        number = (int64_t)MAX_MILLIS;
    } else {
        number = (int64_t)date;
    }
    if (number < 0) {
        negative = TRUE;
        number *= -1;
    }
    i = 0;
    do {
        digits[i++] = (int32_t)(number % 10);
        number /= 10;
    } while (number != 0);

    if (negative) {
        str.append(MINUS);
    }
    i--;
    while (i >= 0) {
        str.append((UChar)(digits[i--] + 0x0030));
    }
    return str;
}